

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvex2dConvex2dAlgorithm.h
# Opt level: O2

btCollisionAlgorithm * __thiscall
btConvex2dConvex2dAlgorithm::CreateFunc::CreateCollisionAlgorithm
          (CreateFunc *this,btCollisionAlgorithmConstructionInfo *ci,
          btCollisionObjectWrapper *body0Wrap,btCollisionObjectWrapper *body1Wrap)

{
  int iVar1;
  undefined4 extraout_var;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc8;
  
  iVar1 = (*ci->m_dispatcher1->_vptr_btDispatcher[0xe])(ci->m_dispatcher1,0x38);
  btConvex2dConvex2dAlgorithm
            ((btConvex2dConvex2dAlgorithm *)CONCAT44(extraout_var,iVar1),ci->m_manifold,ci,body0Wrap
             ,body1Wrap,this->m_simplexSolver,this->m_pdSolver,in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffc8);
  return (btCollisionAlgorithm *)(btConvex2dConvex2dAlgorithm *)CONCAT44(extraout_var,iVar1);
}

Assistant:

virtual	btCollisionAlgorithm* CreateCollisionAlgorithm(btCollisionAlgorithmConstructionInfo& ci, const btCollisionObjectWrapper* body0Wrap,const btCollisionObjectWrapper* body1Wrap)
		{
			void* mem = ci.m_dispatcher1->allocateCollisionAlgorithm(sizeof(btConvex2dConvex2dAlgorithm));
			return new(mem) btConvex2dConvex2dAlgorithm(ci.m_manifold,ci,body0Wrap,body1Wrap,m_simplexSolver,m_pdSolver,m_numPerturbationIterations,m_minimumPointsPerturbationThreshold);
		}